

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O1

void __thiscall
duckdb::PhysicalPiecewiseMergeJoin::ResolveSimpleJoin
          (PhysicalPiecewiseMergeJoin *this,ExecutionContext *context,DataChunk *input,
          DataChunk *chunk,OperatorState *state_p)

{
  OperatorState *this_00;
  ulong *puVar1;
  idx_t iVar2;
  __int_type _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  byte bVar4;
  SortLayout *pSVar5;
  BufferManager *pBVar6;
  int iVar7;
  int iVar8;
  pointer pGVar9;
  const_reference pvVar10;
  type state;
  pointer pGVar11;
  reference pvVar12;
  pointer pLVar13;
  reference this_02;
  type pRVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  NotImplementedException *this_03;
  ulong uVar16;
  type pLVar17;
  DataChunk *left;
  ulong uVar18;
  ulong uVar19;
  idx_t iVar20;
  Vector *key;
  pointer this_04;
  idx_t idx_in_entry;
  char cVar21;
  bool bVar22;
  bool external;
  data_ptr_t l_ptr;
  SBScanState lread;
  SBScanState rread;
  bool found_match [2048];
  bool local_9f1;
  type local_9f0;
  pointer local_9e8;
  ulong local_9e0;
  DataChunk *local_9d8;
  DataChunk *local_9d0;
  SortLayout *local_9c8;
  idx_t local_9c0;
  idx_t local_9b8;
  ulong local_9b0;
  pointer local_9a8;
  data_ptr_t local_9a0;
  data_ptr_t local_998;
  PhysicalPiecewiseMergeJoin *local_990;
  SBScanState local_988;
  SBScanState local_8e0;
  bool local_838 [2056];
  
  local_9d8 = chunk;
  pGVar9 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                       super_PhysicalJoin.super_CachingPhysicalOperator.super_PhysicalOperator.
                       sink_state);
  PiecewiseMergeJoinState::ResolveJoinKeys((PiecewiseMergeJoinState *)state_p,input);
  this_00 = state_p + 0x21;
  local_9f0 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
              ::operator*((unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
                           *)this_00);
  switchD_0105b559::default(local_838,0,0x800);
  local_990 = this;
  pvVar10 = vector<duckdb::JoinCondition,_true>::operator[]
                      (&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions,0);
  iVar7 = MergeJoinComparisonValue(pvVar10->comparison);
  local_9d0 = (DataChunk *)state_p;
  state = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
          operator*((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                     *)(state_p + 0x22));
  pGVar9 = pGVar9 + 1;
  pGVar11 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
            ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                          *)pGVar9);
  local_9a8 = (pointer)CONCAT71(local_9a8._1_7_,(state->sort_layout).all_constant);
  local_9f1 = state->external;
  SBScanState::SBScanState(&local_988,state->buffer_manager,state);
  pvVar12 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
            ::operator[](&state->sorted_blocks,0);
  local_988.sb = (pvVar12->
                 super_unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>
                 .super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl;
  pLVar13 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
            ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
                          *)this_00);
  iVar20 = pLVar13->count;
  pLVar13 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
            ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
                          *)this_00);
  iVar2 = pLVar13->has_null;
  MergeJoinPinSortingBlock(&local_988,0);
  local_988.entry_idx = 0;
  local_9b0 = iVar20 - iVar2;
  local_9a0 = SBScanState::RadixPtr(&local_988);
  SBScanState::SBScanState
            (&local_8e0,(pGVar11->global_sort_state).buffer_manager,&pGVar11->global_sort_state);
  pvVar12 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
            ::operator[](&(pGVar11->global_sort_state).sorted_blocks,0);
  local_8e0.sb = (pvVar12->
                 super_unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>
                 .super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl;
  local_9e8 = pGVar9;
  if (*(pointer *)((long)&(local_8e0.sb)->radix_sorting_data + 8) !=
      *(pointer *)&(local_8e0.sb)->radix_sorting_data) {
    local_9c8 = &state->sort_layout;
    local_9b8 = (state->sort_layout).comparison_size;
    local_9c0 = (state->sort_layout).entry_size;
    iVar20 = 0;
    local_9e0 = 0;
    uVar19 = 0;
    do {
      pGVar9 = local_9e8;
      MergeJoinPinSortingBlock(&local_8e0,iVar20);
      this_02 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                ::operator[](&(local_8e0.sb)->radix_sorting_data,iVar20);
      pRVar14 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                operator*(this_02);
      iVar2 = pRVar14->count;
      pGVar11 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                              *)pGVar9);
      _Var3 = (pGVar11->count).super___atomic_base<unsigned_long>._M_i;
      pGVar11 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                              *)pGVar9);
      uVar16 = _Var3 - (pGVar11->has_null).super___atomic_base<unsigned_long>._M_i;
      uVar18 = iVar2 + local_9e0;
      if (uVar16 < local_9e0) {
        uVar16 = local_9e0;
      }
      if (uVar18 < uVar16) {
        uVar16 = uVar18;
      }
      if (uVar16 == local_9e0) {
        bVar22 = false;
      }
      else {
        uVar18 = ~local_9e0;
        local_9e0 = local_9e0 + pRVar14->count;
        local_8e0.entry_idx = uVar16 + uVar18;
        local_998 = SBScanState::RadixPtr(&local_8e0);
        pSVar5 = local_9c8;
        do {
          if ((char)local_9a8 == '\0') {
            local_988.entry_idx = uVar19;
            local_8e0.entry_idx = uVar16 + uVar18;
            iVar8 = Comparators::CompareTuple
                              (&local_988,&local_8e0,&local_9a0,&local_998,pSVar5,&local_9f1);
          }
          else {
            iVar8 = FastMemcmp(local_9a0,local_998,local_9b8);
          }
          cVar21 = '\x06';
          if (iVar8 <= iVar7) {
            local_838[uVar19] = true;
            local_9a0 = local_9a0 + local_9c0;
            uVar19 = uVar19 + 1;
            cVar21 = local_9b0 <= uVar19;
          }
        } while (cVar21 == '\0');
        bVar22 = cVar21 == '\x06';
      }
    } while ((bVar22) &&
            (iVar20 = iVar20 + 1,
            iVar20 < (ulong)((long)*(pointer *)
                                    ((long)&((local_8e0.sb)->radix_sorting_data).
                                            super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                                            .
                                            super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                                            ._M_impl.super__Vector_impl_data + 8) -
                             *(long *)&((local_8e0.sb)->radix_sorting_data).
                                       super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                                       .
                                       super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                                       ._M_impl.super__Vector_impl_data >> 3)));
  }
  BufferHandle::~BufferHandle(&local_8e0.payload_heap_handle);
  BufferHandle::~BufferHandle(&local_8e0.payload_data_handle);
  BufferHandle::~BufferHandle(&local_8e0.blob_sorting_heap_handle);
  BufferHandle::~BufferHandle(&local_8e0.blob_sorting_data_handle);
  BufferHandle::~BufferHandle(&local_8e0.radix_handle);
  BufferHandle::~BufferHandle(&local_988.payload_heap_handle);
  BufferHandle::~BufferHandle(&local_988.payload_data_handle);
  BufferHandle::~BufferHandle(&local_988.blob_sorting_heap_handle);
  BufferHandle::~BufferHandle(&local_988.blob_sorting_data_handle);
  BufferHandle::~BufferHandle(&local_988.radix_handle);
  left = (DataChunk *)((long)local_9d0 + 0x40);
  cVar21 = (local_990->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.super_PhysicalJoin.
           super_CachingPhysicalOperator.field_0x81;
  if (cVar21 == '\x05') {
    PhysicalJoin::ConstructSemiJoinResult(left,local_9d8,local_838);
  }
  else if (cVar21 == '\x06') {
    PhysicalJoin::ConstructAntiJoinResult(left,local_9d8,local_838);
  }
  else {
    if (cVar21 != '\a') {
      this_03 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_988.buffer_manager = (BufferManager *)&local_988.state;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_988,"Unimplemented join type for merge join","");
      NotImplementedException::NotImplementedException(this_03,(string *)&local_988);
      __cxa_throw(this_03,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_9c8 = (SortLayout *)&local_9f0->keys;
    this_04 = (local_9f0->keys).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_9a8 = (local_9f0->keys).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_9d0 = left;
    if (this_04 != local_9a8) {
      uVar19 = local_9f0->count - local_9f0->has_null;
      local_9b0 = uVar19 + 0x3f >> 6;
      local_9b8 = local_9b0 - 1;
      local_9e0 = local_9b0 * 8 - 8;
      local_9c0 = -(ulong)((uVar19 & 0x3f) == 0) | ~(-1L << ((byte)uVar19 & 0x3f));
      do {
        Vector::Flatten(this_04,(local_9f0->keys).count);
        FlatVector::VerifyFlatVector(this_04);
        if ((this_04->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          if (uVar19 != 0) {
            if (local_9b8 != 0) {
              switchD_0105b559::default
                        ((this_04->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_mask,0xff,local_9e0);
            }
            puVar1 = (this_04->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (local_9b0 - 1);
            *puVar1 = *puVar1 | local_9c0;
          }
          if (uVar19 < local_9f0->count) {
            pLVar17 = local_9f0;
            uVar16 = uVar19;
            do {
              if ((this_04->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                local_8e0.buffer_manager =
                     (BufferManager *)
                     (this_04->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_988,(unsigned_long *)&local_8e0);
                pSVar5 = local_988.sort_layout;
                pBVar6 = local_988.buffer_manager;
                local_988.buffer_manager = (BufferManager *)0x0;
                local_988.sort_layout = (SortLayout *)0x0;
                this_01 = (this_04->validity).super_TemplatedValidityMask<unsigned_long>.
                          validity_data.internal.
                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
                (this_04->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)pBVar6;
                (this_04->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pSVar5;
                if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
                }
                if (local_988.sort_layout != (SortLayout *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_988.sort_layout);
                }
                pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (&(this_04->validity).super_TemplatedValidityMask<unsigned_long>
                                      .validity_data);
                (this_04->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     (pTVar15->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
                pLVar17 = local_9f0;
              }
              bVar4 = (byte)uVar16 & 0x3f;
              puVar1 = (this_04->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                       + (uVar16 >> 6);
              *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
              uVar16 = uVar16 + 1;
            } while (uVar16 < pLVar17->count);
          }
        }
        this_04 = this_04 + 1;
      } while (this_04 != local_9a8);
    }
    pGVar11 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
              ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                            *)local_9e8);
    PhysicalJoin::ConstructMarkJoinResult
              ((DataChunk *)local_9c8,local_9d0,local_9d8,local_838,
               (pGVar11->has_null).super___atomic_base<unsigned_long>._M_i != 0);
  }
  return;
}

Assistant:

void PhysicalPiecewiseMergeJoin::ResolveSimpleJoin(ExecutionContext &context, DataChunk &input, DataChunk &chunk,
                                                   OperatorState &state_p) const {
	auto &state = state_p.Cast<PiecewiseMergeJoinState>();
	auto &gstate = sink_state->Cast<MergeJoinGlobalState>();

	state.ResolveJoinKeys(input);
	auto &lhs_table = *state.lhs_local_table;

	// perform the actual join
	bool found_match[STANDARD_VECTOR_SIZE];
	memset(found_match, 0, sizeof(found_match));
	MergeJoinSimpleBlocks(state, gstate, found_match, conditions[0].comparison);

	// use the sorted payload
	const auto lhs_not_null = lhs_table.count - lhs_table.has_null;
	auto &payload = state.lhs_payload;

	// now construct the result based on the join result
	switch (join_type) {
	case JoinType::MARK: {
		// The only part of the join keys that is actually used is the validity mask.
		// Since the payload is sorted, we can just set the tail end of the validity masks to invalid.
		for (auto &key : lhs_table.keys.data) {
			key.Flatten(lhs_table.keys.size());
			auto &mask = FlatVector::Validity(key);
			if (mask.AllValid()) {
				continue;
			}
			mask.SetAllValid(lhs_not_null);
			for (idx_t i = lhs_not_null; i < lhs_table.count; ++i) {
				mask.SetInvalid(i);
			}
		}
		// So we make a set of keys that have the validity mask set for the
		PhysicalJoin::ConstructMarkJoinResult(lhs_table.keys, payload, chunk, found_match, gstate.table->has_null);
		break;
	}
	case JoinType::SEMI:
		PhysicalJoin::ConstructSemiJoinResult(payload, chunk, found_match);
		break;
	case JoinType::ANTI:
		PhysicalJoin::ConstructAntiJoinResult(payload, chunk, found_match);
		break;
	default:
		throw NotImplementedException("Unimplemented join type for merge join");
	}
}